

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O0

void __thiscall fmt::v6::detail::bigint::assign_pow10(bigint *this,int exp)

{
  uint local_18;
  int bitmask;
  int exp_local;
  bigint *this_local;
  
  if (-1 < exp) {
    if (exp == 0) {
      assign(this,1);
    }
    else {
      for (local_18 = 1; (int)local_18 <= exp; local_18 = local_18 << 1) {
      }
      assign(this,5);
      for (local_18 = (int)local_18 >> 2; local_18 != 0; local_18 = (int)local_18 >> 1) {
        square(this);
        if ((exp & local_18) != 0) {
          operator*=(this,5);
        }
      }
      operator<<=(this,exp);
    }
    return;
  }
  __assert_fail("exp >= 0",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/GPMueller[P]imgui-cmake/thirdparty/fmt/include/fmt/format-inl.h"
                ,0x29c,"void fmt::detail::bigint::assign_pow10(int)");
}

Assistant:

void assign_pow10(int exp) {
    assert(exp >= 0);
    if (exp == 0) return assign(1);
    // Find the top bit.
    int bitmask = 1;
    while (exp >= bitmask) bitmask <<= 1;
    bitmask >>= 1;
    // pow(10, exp) = pow(5, exp) * pow(2, exp). First compute pow(5, exp) by
    // repeated squaring and multiplication.
    assign(5);
    bitmask >>= 1;
    while (bitmask != 0) {
      square();
      if ((exp & bitmask) != 0) *this *= 5;
      bitmask >>= 1;
    }
    *this <<= exp;  // Multiply by pow(2, exp) by shifting.
  }